

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O2

bool __thiscall google::protobuf::safe_strtod(protobuf *this,StringPiece str,double *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  StringPiece str_local;
  
  str_local.ptr_ = str.ptr_;
  local_48 = (undefined1  [8])this;
  StringPiece::ToString_abi_cxx11_((string *)&str_local.length_,(StringPiece *)local_48);
  bVar1 = safe_strtod((char *)str_local.length_,(double *)str.length_);
  std::__cxx11::string::~string((string *)&str_local.length_);
  return bVar1;
}

Assistant:

inline bool safe_strtod(StringPiece str, double* value) {
  return safe_strtod(str.ToString(), value);
}